

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O0

void __thiscall Generator::generateCode(Generator *this)

{
  QByteArrayView bv;
  QByteArrayView bv_00;
  QByteArrayView bv_01;
  bool bVar1;
  bool bVar2;
  byte bVar3;
  QFlags<QtMocConstants::EnumFlags> *pQVar4;
  char *pcVar5;
  char *pcVar6;
  qsizetype qVar7;
  SuperClass *pSVar8;
  QList<ClassDef::Interface> *this_00;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  long *in_RDI;
  long in_FS_OFFSET;
  QStringBuilder<char,_const_QByteArray_&> QVar12;
  QByteArray *propertyType;
  QByteArray *nonClassSignal;
  add_const_t<QList<QByteArray>_> *__range2_1;
  int signalindex;
  qsizetype k;
  qsizetype j;
  QList<ClassDef::Interface> *iface;
  add_const_t<QList<QList<ClassDef::Interface>_>_> *__range1_2;
  char *cname;
  QByteArray *ba;
  add_const_t<QList<QByteArray>_> *__range2;
  qsizetype s_2;
  QByteArray *enumKey;
  QByteArray *scope;
  qsizetype s_1;
  qsizetype s;
  PropertyDef *p;
  add_const_t<QList<PropertyDef>_> *__range1_1;
  char *n;
  char *metaObjectFlags;
  char *uintDataParams;
  char *ownType;
  bool hasStaticMetaCall;
  bool requireCompleteness;
  add_const_t<QList<EnumDef>_> *__range1;
  bool isConstructible;
  bool isQObject;
  const_iterator propertyIt;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  QByteArray superClass;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  const_iterator end_1;
  const_iterator it_1;
  const_iterator __end2;
  const_iterator __begin2;
  QByteArray scope_1;
  key_iterator end;
  key_iterator it;
  QByteArray currentScope;
  QByteArray thisScope;
  ConstIterator scopeIt;
  QByteArray unqualifiedScope;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  QMultiHash<QByteArray,_QByteArray> knownExtraMetaObject;
  QList<QByteArray> extraList;
  QByteArray metaVarNameSuffix;
  QByteArray tagType;
  QByteArray qualifiedClassNameIdentifier;
  QByteArray alias;
  const_iterator __end1;
  const_iterator __begin1;
  QList<EnumDef> enumList;
  EnumDef def;
  Generator *in_stack_fffffffffffff968;
  Generator *in_stack_fffffffffffff970;
  const_iterator in_stack_fffffffffffff978;
  Generator *in_stack_fffffffffffff980;
  FILE *pFVar13;
  Generator *in_stack_fffffffffffff988;
  Generator *in_stack_fffffffffffff990;
  anon_class_8_1_2b509771_for__M_pred in_stack_fffffffffffff998;
  const_iterator in_stack_fffffffffffff9a0;
  const_iterator in_stack_fffffffffffff9a8;
  Generator *in_stack_fffffffffffff9b0;
  Generator *in_stack_fffffffffffff9b8;
  Generator *in_stack_fffffffffffff9c8;
  FILE *in_stack_fffffffffffff9e0;
  FILE *in_stack_fffffffffffff9e8;
  FILE *in_stack_fffffffffffff9f0;
  Generator *in_stack_fffffffffffff9f8;
  QList<FunctionDef> *in_stack_fffffffffffffa00;
  long lVar14;
  Generator *in_stack_fffffffffffffa08;
  byte local_591;
  bool local_581;
  char *local_540;
  byte local_532;
  byte local_531;
  int local_4e4;
  long local_4e0;
  long local_4d8;
  char *local_460;
  char *local_458;
  byte local_442;
  const_iterator local_428;
  QByteArray *local_420;
  const_iterator local_418;
  const_iterator local_410;
  undefined1 *local_408;
  undefined1 *local_400;
  undefined1 *local_3f8;
  QByteArray local_3f0;
  QList<ClassDef::Interface> *local_3d8;
  const_iterator local_3d0;
  const_iterator local_3c8;
  SuperClass *local_3c0;
  const_iterator local_3b8;
  SuperClass *local_3b0;
  const_iterator local_3a8;
  QByteArray *local_3a0;
  const_iterator local_398;
  const_iterator local_390;
  char *local_388;
  undefined1 *local_380;
  undefined1 *local_378;
  undefined1 *local_370;
  const_iterator local_358;
  const_iterator local_350;
  const_iterator local_348;
  char *local_340;
  Generator *in_stack_fffffffffffffcd8;
  const_iterator local_320;
  Data<QHashPrivate::MultiNode<QByteArray,_QByteArray>_> *local_308;
  undefined1 *local_300;
  Chain **local_2f8;
  QStringBuilder<QByteArray_&,_const_char_(&)[3]> local_2f0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  undefined1 *local_288;
  undefined1 *local_280;
  undefined1 *local_278;
  const_iterator local_270;
  undefined1 *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  PropertyDef *local_230;
  const_iterator local_228;
  const_iterator local_220;
  undefined1 *local_218;
  undefined1 *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  QStringBuilder<const_char_(&)[14],_const_QByteArray_&> local_1f0;
  undefined1 local_1a9;
  char local_1a8;
  QByteArray *local_1a0;
  undefined1 *local_180;
  undefined1 *local_178;
  undefined1 *local_170;
  QStringBuilder<const_char_(&)[13],_const_QByteArray_&> local_168;
  QArrayDataPointer<char> local_128;
  undefined1 *local_110;
  undefined1 *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  QFlagsStorageHelper<QtMocConstants::EnumFlags,_4> local_dc;
  undefined1 *local_c0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  EnumDef *local_a8;
  const_iterator local_a0;
  const_iterator local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  undefined1 *local_80;
  char *local_78;
  QByteArray local_70;
  QByteArray aQStack_58 [3];
  QFlags<QtMocConstants::EnumFlags> aQStack_10 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_78 = "QObject";
  bVar1 = ::operator==((QByteArray *)in_stack_fffffffffffff980,
                       (char **)in_stack_fffffffffffff978._M_node);
  bVar2 = QList<FunctionDef>::isEmpty((QList<FunctionDef> *)0x108db8);
  bVar3 = (bVar2 ^ 0xffU) & 1;
  local_90 = &DAT_aaaaaaaaaaaaaaaa;
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  local_80 = &DAT_aaaaaaaaaaaaaaaa;
  QList<EnumDef>::QList((QList<EnumDef> *)0x108dfd);
  local_98.i = (EnumDef *)&DAT_aaaaaaaaaaaaaaaa;
  local_98 = QList<EnumDef>::begin((QList<EnumDef> *)in_stack_fffffffffffff970);
  local_a0.i = (EnumDef *)&DAT_aaaaaaaaaaaaaaaa;
  local_a0 = QList<EnumDef>::end((QList<EnumDef> *)in_stack_fffffffffffff970);
  while( true ) {
    local_a8 = local_a0.i;
    bVar2 = QList<EnumDef>::const_iterator::operator!=(&local_98,local_a0);
    if (!bVar2) break;
    memset(&local_70,0xaa,0x68);
    QList<EnumDef>::const_iterator::operator*(&local_98);
    EnumDef::EnumDef((EnumDef *)in_stack_fffffffffffff970,(EnumDef *)in_stack_fffffffffffff968);
    bVar2 = QMap<QByteArray,_QFlags<QtMocConstants::EnumFlags>_>::contains
                      ((QMap<QByteArray,_QFlags<QtMocConstants::EnumFlags>_> *)
                       in_stack_fffffffffffff980,(QByteArray *)in_stack_fffffffffffff978._M_node);
    if (bVar2) {
      QList<EnumDef>::operator+=
                ((QList<EnumDef> *)in_stack_fffffffffffff970,
                 (parameter_type)in_stack_fffffffffffff968);
    }
    QByteArray::operator=(aQStack_58,(QByteArray *)&local_70);
    local_c0 = &DAT_aaaaaaaaaaaaaaaa;
    local_b8 = &DAT_aaaaaaaaaaaaaaaa;
    local_b0 = &DAT_aaaaaaaaaaaaaaaa;
    QByteArray::QByteArray((QByteArray *)0x108f84);
    QMap<QByteArray,_QByteArray>::value
              ((QMap<QByteArray,_QByteArray> *)in_stack_fffffffffffff990,
               (QByteArray *)in_stack_fffffffffffff988,(QByteArray *)in_stack_fffffffffffff980);
    QByteArray::~QByteArray((QByteArray *)0x108fb6);
    bVar2 = QMap<QByteArray,_QFlags<QtMocConstants::EnumFlags>_>::contains
                      ((QMap<QByteArray,_QFlags<QtMocConstants::EnumFlags>_> *)
                       in_stack_fffffffffffff980,(QByteArray *)in_stack_fffffffffffff978._M_node);
    if (bVar2) {
      QByteArray::operator=(&local_70,(QByteArray *)&local_c0);
      pQVar4 = QMap<QByteArray,_QFlags<QtMocConstants::EnumFlags>_>::operator[]
                         ((QMap<QByteArray,_QFlags<QtMocConstants::EnumFlags>_> *)
                          in_stack_fffffffffffff998.nonClassSignal,
                          (QByteArray *)in_stack_fffffffffffff990);
      local_dc.super_QFlagsStorage<QtMocConstants::EnumFlags>.i =
           (QFlagsStorage<QtMocConstants::EnumFlags>)
           (pQVar4->super_QFlagsStorageHelper<QtMocConstants::EnumFlags,_4>).
           super_QFlagsStorage<QtMocConstants::EnumFlags>.i;
      QFlags<QtMocConstants::EnumFlags>::operator|=
                (aQStack_10,
                 (QFlags<QtMocConstants::EnumFlags>)
                 local_dc.super_QFlagsStorage<QtMocConstants::EnumFlags>.i);
      QList<EnumDef>::operator+=
                ((QList<EnumDef> *)in_stack_fffffffffffff970,
                 (parameter_type)in_stack_fffffffffffff968);
    }
    QByteArray::~QByteArray((QByteArray *)0x10904e);
    EnumDef::~EnumDef((EnumDef *)in_stack_fffffffffffff970);
    QList<EnumDef>::const_iterator::operator++(&local_98);
  }
  QList<EnumDef>::operator=
            ((QList<EnumDef> *)in_stack_fffffffffffff970,(QList<EnumDef> *)in_stack_fffffffffffff968
            );
  QList<EnumDef>::~QList((QList<EnumDef> *)0x109097);
  strreg(in_stack_fffffffffffff970,(QByteArray *)in_stack_fffffffffffff968);
  registerClassInfoStrings(in_stack_fffffffffffff980);
  registerFunctionStrings
            ((Generator *)in_stack_fffffffffffff998.nonClassSignal,
             (QList<FunctionDef> *)in_stack_fffffffffffff990);
  registerFunctionStrings
            ((Generator *)in_stack_fffffffffffff998.nonClassSignal,
             (QList<FunctionDef> *)in_stack_fffffffffffff990);
  registerFunctionStrings
            ((Generator *)in_stack_fffffffffffff998.nonClassSignal,
             (QList<FunctionDef> *)in_stack_fffffffffffff990);
  registerFunctionStrings
            ((Generator *)in_stack_fffffffffffff998.nonClassSignal,
             (QList<FunctionDef> *)in_stack_fffffffffffff990);
  registerByteArrayVector
            (in_stack_fffffffffffff980,(QList<QByteArray> *)in_stack_fffffffffffff978._M_node);
  registerPropertyStrings(in_stack_fffffffffffff980);
  registerEnumStrings(in_stack_fffffffffffff988);
  local_531 = 1;
  if ((*(byte *)(in_RDI + 0x11) & 1) == 0) {
    local_531 = *(byte *)(in_RDI[2] + 0x1a7);
  }
  local_532 = 1;
  if ((*(byte *)(in_RDI[2] + 0x1a4) & 1) == 0) {
    bVar2 = QList<FunctionDef>::isEmpty((QList<FunctionDef> *)0x1091c5);
    local_532 = 1;
    if (bVar2) {
      bVar2 = QList<PropertyDef>::isEmpty((QList<PropertyDef> *)0x1091ef);
      local_532 = 1;
      if (bVar2) {
        bVar2 = QList<FunctionDef>::isEmpty((QList<FunctionDef> *)0x109219);
        local_532 = bVar2 ^ 0xff;
      }
    }
  }
  local_442 = local_532 & 1;
  if ((*(byte *)(*in_RDI + 0x22) & 1) != 0) {
    local_442 = 0;
  }
  local_f8 = &DAT_aaaaaaaaaaaaaaaa;
  local_f0 = &DAT_aaaaaaaaaaaaaaaa;
  local_e8 = &DAT_aaaaaaaaaaaaaaaa;
  generateQualifiedClassNameIdentifier((QByteArray *)in_stack_fffffffffffff990);
  if ((*(byte *)(in_RDI[2] + 0x1a6) & 1) == 0) {
    local_540 = QByteArray::data((QByteArray *)in_stack_fffffffffffff970);
  }
  else {
    local_540 = "void";
  }
  pFVar13 = (FILE *)in_RDI[1];
  pcVar5 = QByteArray::constData((QByteArray *)0x109308);
  fprintf(pFVar13,"namespace {\nstruct qt_meta_tag_%s_t {};\n} // unnamed namespace\n\n",pcVar5);
  pFVar13 = (FILE *)in_RDI[1];
  pcVar5 = QByteArray::constData((QByteArray *)0x109342);
  pcVar6 = QByteArray::constData((QByteArray *)0x109357);
  fprintf(pFVar13,
          "template <> constexpr inline auto %s::qt_create_metaobjectdata<qt_meta_tag_%s_t>()\n{\n    namespace QMC = QtMocConstants;\n"
          ,pcVar5,pcVar6);
  fprintf((FILE *)in_RDI[1],"    QtMocHelpers::StringRefStorage qt_stringData {");
  addStrings(in_stack_fffffffffffff990,(QByteArrayList *)in_stack_fffffffffffff988);
  fprintf((FILE *)in_RDI[1],"\n    };\n\n");
  fprintf((FILE *)in_RDI[1],"    QtMocHelpers::UintData qt_methods {\n");
  addFunctions(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,(char *)in_stack_fffffffffffff9f8
              );
  addFunctions(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,(char *)in_stack_fffffffffffff9f8
              );
  addFunctions(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,(char *)in_stack_fffffffffffff9f8
              );
  fprintf((FILE *)in_RDI[1],"    };\n    QtMocHelpers::UintData qt_properties {\n");
  addProperties(in_stack_fffffffffffff9b0);
  fprintf((FILE *)in_RDI[1],"    };\n    QtMocHelpers::UintData qt_enums {\n");
  addEnums(in_stack_fffffffffffff9f8);
  fprintf((FILE *)in_RDI[1],"    };\n");
  local_458 = "";
  if ((bVar3 != 0) ||
     (bVar2 = QList<ClassInfoDef>::isEmpty((QList<ClassInfoDef> *)0x1094cd), !bVar2)) {
    if (bVar3 == 0) {
      fputs("    QtMocHelpers::UintData qt_constructors {};\n",(FILE *)in_RDI[1]);
    }
    else {
      fprintf((FILE *)in_RDI[1],
              "    using Constructor = QtMocHelpers::NoType;\n    QtMocHelpers::UintData qt_constructors {\n"
             );
      addFunctions(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,
                   (char *)in_stack_fffffffffffff9f8);
      fprintf((FILE *)in_RDI[1],"    };\n");
    }
    local_458 = ", qt_constructors";
    bVar2 = QList<ClassInfoDef>::isEmpty((QList<ClassInfoDef> *)0x109570);
    if (!bVar2) {
      fprintf((FILE *)in_RDI[1],"    QtMocHelpers::ClassInfos qt_classinfo({\n");
      addClassInfos(in_stack_fffffffffffff990);
      fprintf((FILE *)in_RDI[1],"    });\n");
      local_458 = ", qt_constructors, qt_classinfo";
    }
  }
  local_460 = "QMC::MetaObjectFlag{}";
  if (((*(byte *)(in_RDI[2] + 0x1a5) & 1) != 0) || ((*(byte *)(in_RDI[2] + 0x1a6) & 1) != 0)) {
    local_460 = "QMC::PropertyAccessInStaticMetaCall";
  }
  local_110 = &DAT_aaaaaaaaaaaaaaaa;
  local_108 = &DAT_aaaaaaaaaaaaaaaa;
  local_100 = &DAT_aaaaaaaaaaaaaaaa;
  QArrayDataPointer<char>::QArrayDataPointer(&local_128,(Data *)0x0,"void",4);
  QByteArray::QByteArray
            ((QByteArray *)in_stack_fffffffffffff970,(DataPointer *)in_stack_fffffffffffff968);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)in_stack_fffffffffffff970);
  if ((local_531 & 1) == 0) {
    local_168 = ::operator+((char (*) [13])in_stack_fffffffffffff970,
                            (QByteArray *)in_stack_fffffffffffff968);
    ::operator+((QStringBuilder<const_char_(&)[13],_const_QByteArray_&> *)in_stack_fffffffffffff970,
                (char (*) [3])in_stack_fffffffffffff968);
    ::QStringBuilder::operator_cast_to_QByteArray
              ((QStringBuilder<QStringBuilder<const_char_(&)[13],_const_QByteArray_&>,_const_char_(&)[3]>
                *)in_stack_fffffffffffff968);
    QByteArray::operator=
              ((QByteArray *)in_stack_fffffffffffff970,(QByteArray *)in_stack_fffffffffffff968);
    QByteArray::~QByteArray((QByteArray *)0x1096fb);
  }
  pFVar13 = (FILE *)in_RDI[1];
  pcVar5 = QByteArray::constData((QByteArray *)0x10972c);
  fprintf(pFVar13,
          "    return QtMocHelpers::metaObjectData<%s, %s>(%s, qt_stringData,\n            qt_methods, qt_properties, qt_enums%s);\n}\n"
          ,local_540,pcVar5,local_460,local_458);
  QByteArray::~QByteArray((QByteArray *)0x10976a);
  local_180 = &DAT_aaaaaaaaaaaaaaaa;
  local_178 = &DAT_aaaaaaaaaaaaaaaa;
  local_170 = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray((QByteArray *)0x1097a4);
  if ((*(byte *)(in_RDI[2] + 0x1a6) & 1) == 0) {
    local_1f0 = ::operator+((char (*) [14])in_stack_fffffffffffff970,
                            (QByteArray *)in_stack_fffffffffffff968);
    ::operator+((QStringBuilder<const_char_(&)[14],_const_QByteArray_&> *)in_stack_fffffffffffff970,
                (char (*) [4])in_stack_fffffffffffff968);
    ::QStringBuilder::operator_cast_to_QByteArray
              ((QStringBuilder<QStringBuilder<const_char_(&)[14],_const_QByteArray_&>,_const_char_(&)[4]>
                *)in_stack_fffffffffffff968);
    QByteArray::operator=
              ((QByteArray *)in_stack_fffffffffffff970,(QByteArray *)in_stack_fffffffffffff968);
    QByteArray::~QByteArray((QByteArray *)0x109939);
  }
  else {
    local_1a9 = 0x5f;
    QVar12 = ::operator+((char *)in_stack_fffffffffffff970,(QByteArray *)in_stack_fffffffffffff968);
    local_1a0 = QVar12.b;
    local_1a8 = QVar12.a;
    ::QStringBuilder::operator_cast_to_QByteArray
              ((QStringBuilder<char,_const_QByteArray_&> *)in_stack_fffffffffffff968);
    QByteArray::operator=
              ((QByteArray *)in_stack_fffffffffffff970,(QByteArray *)in_stack_fffffffffffff968);
    QByteArray::~QByteArray((QByteArray *)0x109820);
    in_stack_fffffffffffff968 = (Generator *)QByteArray::constData((QByteArray *)0x10982d);
    pFVar13 = (FILE *)in_RDI[1];
    pcVar5 = QByteArray::constData((QByteArray *)0x109869);
    in_stack_fffffffffffff970 = in_stack_fffffffffffff968;
    in_stack_fffffffffffff978._M_node = (_Base_ptr)in_stack_fffffffffffff968;
    fprintf(pFVar13,
            "\nstatic constexpr auto qt_staticMetaObjectContent%s =\n    %s::qt_create_metaobjectdata<qt_meta_tag%s_t>();\nstatic constexpr auto qt_staticMetaObjectStaticContent%s =\n    qt_staticMetaObjectContent%s.staticData;\nstatic constexpr auto qt_staticMetaObjectRelocatingContent%s =\n    qt_staticMetaObjectContent%s.relocatingData;\n\n"
            ,in_stack_fffffffffffff968,pcVar5,in_stack_fffffffffffff968,in_stack_fffffffffffff968);
  }
  local_208 = &DAT_aaaaaaaaaaaaaaaa;
  local_200 = &DAT_aaaaaaaaaaaaaaaa;
  local_1f8 = &DAT_aaaaaaaaaaaaaaaa;
  QList<QByteArray>::QList((QList<QByteArray> *)0x109973);
  local_218 = &DAT_aaaaaaaaaaaaaaaa;
  local_210 = &DAT_aaaaaaaaaaaaaaaa;
  QMultiHash<QByteArray,_QByteArray>::QMultiHash
            ((QMultiHash<QByteArray,_QByteArray> *)in_stack_fffffffffffff990,
             (QHash<QByteArray,_QByteArray> *)in_stack_fffffffffffff988);
  QMultiHash<QByteArray,_QByteArray>::unite
            ((QMultiHash<QByteArray,_QByteArray> *)in_stack_fffffffffffff980,
             (QHash<QByteArray,_QByteArray> *)in_stack_fffffffffffff978._M_node);
  local_220.i = (PropertyDef *)&DAT_aaaaaaaaaaaaaaaa;
  local_220 = QList<PropertyDef>::begin((QList<PropertyDef> *)in_stack_fffffffffffff970);
  local_228.i = (PropertyDef *)&DAT_aaaaaaaaaaaaaaaa;
  local_228 = QList<PropertyDef>::end((QList<PropertyDef> *)in_stack_fffffffffffff970);
  while( true ) {
    local_230 = local_228.i;
    bVar2 = QList<PropertyDef>::const_iterator::operator!=(&local_220,local_228);
    if (!bVar2) break;
    QList<PropertyDef>::const_iterator::operator*(&local_220);
    bVar2 = isBuiltinType((QByteArray *)in_stack_fffffffffffff968);
    if (((!bVar2) &&
        (bVar2 = QByteArray::contains
                           ((QByteArray *)in_stack_fffffffffffff970,
                            (char)((ulong)in_stack_fffffffffffff968 >> 0x38)), !bVar2)) &&
       ((bVar2 = QByteArray::contains
                           ((QByteArray *)in_stack_fffffffffffff970,
                            (char)((ulong)in_stack_fffffffffffff968 >> 0x38)), !bVar2 &&
        (bVar2 = QByteArray::contains
                           ((QByteArray *)in_stack_fffffffffffff970,
                            (char)((ulong)in_stack_fffffffffffff968 >> 0x38)), !bVar2)))) {
      QByteArrayView::QByteArrayView<3ul>
                ((QByteArrayView *)in_stack_fffffffffffff980,
                 (char (*) [3])in_stack_fffffffffffff978._M_node);
      bv.m_data = (storage_type *)in_stack_fffffffffffff998.nonClassSignal;
      bv.m_size = (qsizetype)in_stack_fffffffffffff990;
      qVar7 = QByteArray::lastIndexOf((QByteArray *)in_stack_fffffffffffff978._M_node,bv);
      if (0 < qVar7) {
        local_258 = &DAT_aaaaaaaaaaaaaaaa;
        local_250 = &DAT_aaaaaaaaaaaaaaaa;
        local_248 = &DAT_aaaaaaaaaaaaaaaa;
        QByteArray::left((QByteArray *)in_stack_fffffffffffff980,
                         (qsizetype)in_stack_fffffffffffff998.nonClassSignal);
        local_270.i.d =
             (Data<QHashPrivate::MultiNode<QByteArray,_QByteArray>_> *)&DAT_aaaaaaaaaaaaaaaa;
        local_270.i.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
        local_270.e = (Chain **)&DAT_aaaaaaaaaaaaaaaa;
        QMultiHash<QByteArray,_QByteArray>::const_iterator::const_iterator
                  ((const_iterator *)in_stack_fffffffffffff970);
        local_288 = &DAT_aaaaaaaaaaaaaaaa;
        local_280 = &DAT_aaaaaaaaaaaaaaaa;
        local_278 = &DAT_aaaaaaaaaaaaaaaa;
        QByteArray::QByteArray
                  ((QByteArray *)in_stack_fffffffffffff970,(QByteArray *)in_stack_fffffffffffff968);
        do {
          QByteArrayView::QByteArrayView<3ul>
                    ((QByteArrayView *)in_stack_fffffffffffff980,
                     (char (*) [3])in_stack_fffffffffffff978._M_node);
          bv_00.m_data = (storage_type *)in_stack_fffffffffffff998.nonClassSignal;
          bv_00.m_size = (qsizetype)in_stack_fffffffffffff990;
          QByteArray::lastIndexOf((QByteArray *)in_stack_fffffffffffff978._M_node,bv_00);
          QByteArray::left((QByteArray *)in_stack_fffffffffffff980,
                           (qsizetype)in_stack_fffffffffffff998.nonClassSignal);
          QByteArray::operator=
                    ((QByteArray *)in_stack_fffffffffffff970,(QByteArray *)in_stack_fffffffffffff968
                    );
          QByteArray::~QByteArray((QByteArray *)0x109ca7);
          local_2c8 = &DAT_aaaaaaaaaaaaaaaa;
          local_2c0 = &DAT_aaaaaaaaaaaaaaaa;
          local_2b8 = &DAT_aaaaaaaaaaaaaaaa;
          bVar2 = QByteArray::isEmpty((QByteArray *)0x109ce1);
          if (bVar2) {
            QByteArray::QByteArray
                      ((QByteArray *)in_stack_fffffffffffff970,
                       (QByteArray *)in_stack_fffffffffffff968);
          }
          else {
            local_2f0 = ::operator+((QByteArray *)in_stack_fffffffffffff970,
                                    (char (*) [3])in_stack_fffffffffffff968);
            ::operator+((QStringBuilder<QByteArray_&,_const_char_(&)[3]> *)in_stack_fffffffffffff970
                        ,(QByteArray *)in_stack_fffffffffffff968);
            ::QStringBuilder::operator_cast_to_QByteArray
                      ((QStringBuilder<QStringBuilder<QByteArray_&,_const_char_(&)[3]>,_QByteArray_&>
                        *)in_stack_fffffffffffff968);
          }
          QMultiHash<QByteArray,_QByteArray>::constFind
                    ((QMultiHash<QByteArray,_QByteArray> *)in_stack_fffffffffffff970,
                     (QByteArray *)in_stack_fffffffffffff968);
          local_270.i.d = local_308;
          local_270.i.bucket = (size_t)local_300;
          local_270.e = local_2f8;
          QByteArray::~QByteArray((QByteArray *)0x109dae);
          bVar2 = QByteArray::isEmpty((QByteArray *)0x109dbb);
          local_581 = false;
          if (!bVar2) {
            QMultiHash<QByteArray,_QByteArray>::constEnd
                      ((QMultiHash<QByteArray,_QByteArray> *)in_stack_fffffffffffff970);
            local_581 = QMultiHash<QByteArray,_QByteArray>::const_iterator::operator==
                                  (&local_270,&local_320);
          }
        } while (local_581 != false);
        QMultiHash<QByteArray,_QByteArray>::constEnd
                  ((QMultiHash<QByteArray,_QByteArray> *)in_stack_fffffffffffff970);
        bVar2 = QMultiHash<QByteArray,_QByteArray>::const_iterator::operator==
                          (&local_270,(const_iterator *)&stack0xfffffffffffffcc8);
        if (!bVar2) {
          QMultiHash<QByteArray,_QByteArray>::const_iterator::operator*(&local_270);
          local_340 = "Qt";
          bVar2 = ::operator==((QByteArray *)in_stack_fffffffffffff980,
                               (char **)in_stack_fffffffffffff978._M_node);
          if (((!bVar2) &&
              (bVar2 = qualifiedNameEquals((QByteArray *)in_stack_fffffffffffff988,
                                           (QByteArray *)in_stack_fffffffffffff980), !bVar2)) &&
             (bVar2 = QListSpecialMethodsBase<QByteArray>::contains<QByteArray>
                                ((QListSpecialMethodsBase<QByteArray> *)in_stack_fffffffffffff970,
                                 (QByteArray *)in_stack_fffffffffffff968), !bVar2)) {
            QList<QByteArray>::operator+=
                      ((QList<QByteArray> *)in_stack_fffffffffffff970,
                       (parameter_type)in_stack_fffffffffffff968);
          }
        }
        QByteArray::~QByteArray((QByteArray *)0x109f1f);
        QByteArray::~QByteArray((QByteArray *)0x109f2c);
      }
    }
    QList<PropertyDef>::const_iterator::operator++(&local_220);
  }
  local_348.i._M_node = (const_iterator)&DAT_aaaaaaaaaaaaaaaa;
  local_348.i._M_node =
       (const_iterator)
       QMap<QByteArray,_QFlags<QtMocConstants::EnumFlags>_>::keyBegin
                 ((QMap<QByteArray,_QFlags<QtMocConstants::EnumFlags>_> *)in_stack_fffffffffffff970)
  ;
  local_350.i._M_node = (const_iterator)&DAT_aaaaaaaaaaaaaaaa;
  local_350.i._M_node =
       (const_iterator)
       QMap<QByteArray,_QFlags<QtMocConstants::EnumFlags>_>::keyEnd
                 ((QMap<QByteArray,_QFlags<QtMocConstants::EnumFlags>_> *)in_stack_fffffffffffff970)
  ;
  while( true ) {
    local_358 = local_350.i._M_node;
    bVar2 = QMap<QByteArray,_QFlags<QtMocConstants::EnumFlags>_>::key_iterator::operator!=
                      ((key_iterator *)in_stack_fffffffffffff970,
                       (key_iterator)in_stack_fffffffffffff978._M_node);
    if (!bVar2) break;
    QMap<QByteArray,_QFlags<QtMocConstants::EnumFlags>_>::key_iterator::operator*
              ((key_iterator *)0x109ff7);
    QByteArrayView::QByteArrayView<3ul>
              ((QByteArrayView *)in_stack_fffffffffffff980,
               (char (*) [3])in_stack_fffffffffffff978._M_node);
    bv_01.m_data = (storage_type *)in_stack_fffffffffffff998.nonClassSignal;
    bv_01.m_size = (qsizetype)in_stack_fffffffffffff990;
    qVar7 = QByteArray::lastIndexOf((QByteArray *)in_stack_fffffffffffff978._M_node,bv_01);
    if (0 < qVar7) {
      local_380 = &DAT_aaaaaaaaaaaaaaaa;
      local_378 = &DAT_aaaaaaaaaaaaaaaa;
      local_370 = &DAT_aaaaaaaaaaaaaaaa;
      QByteArray::left((QByteArray *)in_stack_fffffffffffff980,
                       (qsizetype)in_stack_fffffffffffff998.nonClassSignal);
      local_388 = "Qt";
      bVar2 = ::operator!=((QByteArray *)in_stack_fffffffffffff988,
                           (char **)in_stack_fffffffffffff980);
      local_591 = 0;
      if (bVar2) {
        bVar2 = qualifiedNameEquals((QByteArray *)in_stack_fffffffffffff988,
                                    (QByteArray *)in_stack_fffffffffffff980);
        local_591 = 0;
        if (!bVar2) {
          bVar2 = QListSpecialMethodsBase<QByteArray>::contains<QByteArray>
                            ((QListSpecialMethodsBase<QByteArray> *)in_stack_fffffffffffff970,
                             (QByteArray *)in_stack_fffffffffffff968);
          local_591 = bVar2 ^ 0xff;
        }
      }
      if ((local_591 & 1) != 0) {
        QList<QByteArray>::operator+=
                  ((QList<QByteArray> *)in_stack_fffffffffffff970,
                   (parameter_type)in_stack_fffffffffffff968);
      }
      QByteArray::~QByteArray((QByteArray *)0x10a151);
    }
    QMap<QByteArray,_QFlags<QtMocConstants::EnumFlags>_>::key_iterator::operator++
              ((key_iterator *)in_stack_fffffffffffff970);
  }
  bVar2 = QList<QByteArray>::isEmpty((QList<QByteArray> *)0x10a172);
  if (!bVar2) {
    pFVar13 = (FILE *)in_RDI[1];
    pcVar5 = QByteArray::constData((QByteArray *)0x10a19b);
    fprintf(pFVar13,"Q_CONSTINIT static const QMetaObject::SuperData qt_meta_extradata_%s[] = {\n",
            pcVar5);
    local_390.i = (QByteArray *)&DAT_aaaaaaaaaaaaaaaa;
    local_390 = QList<QByteArray>::begin((QList<QByteArray> *)in_stack_fffffffffffff970);
    local_398.i = (QByteArray *)&DAT_aaaaaaaaaaaaaaaa;
    local_398 = QList<QByteArray>::end((QList<QByteArray> *)in_stack_fffffffffffff970);
    while( true ) {
      local_3a0 = local_398.i;
      bVar2 = QList<QByteArray>::const_iterator::operator!=(&local_390,local_398);
      if (!bVar2) break;
      QList<QByteArray>::const_iterator::operator*(&local_390);
      pFVar13 = (FILE *)in_RDI[1];
      pcVar5 = QByteArray::constData((QByteArray *)0x10a294);
      fprintf(pFVar13,"    QMetaObject::SuperData::link<%s::staticMetaObject>(),\n",pcVar5);
      QList<QByteArray>::const_iterator::operator++(&local_390);
    }
    fprintf((FILE *)in_RDI[1],"    nullptr\n};\n\n");
  }
  pFVar13 = (FILE *)in_RDI[1];
  pcVar5 = QByteArray::constData((QByteArray *)0x10a2fa);
  fprintf(pFVar13,"Q_CONSTINIT const QMetaObject %s::staticMetaObject = { {\n",pcVar5);
  if (bVar1) {
    fprintf((FILE *)in_RDI[1],"    nullptr,\n");
  }
  else {
    qVar7 = QList<SuperClass>::size((QList<SuperClass> *)(in_RDI[2] + 0x88));
    if (((qVar7 == 0) || ((*(byte *)(in_RDI[2] + 0x1a5) & 1) != 0)) ||
       ((*(byte *)(in_RDI[2] + 0x1a6) & 1) != 0)) {
      qVar7 = QList<SuperClass>::size((QList<SuperClass> *)(in_RDI[2] + 0x88));
      if (qVar7 == 0) {
        fprintf((FILE *)in_RDI[1],"    nullptr,\n");
      }
      else {
        pFVar13 = (FILE *)in_RDI[1];
        pcVar5 = QByteArray::constData((QByteArray *)0x10a3f7);
        fprintf(pFVar13,"    QtPrivate::MetaObjectForType<%s>::value,\n",pcVar5);
      }
    }
    else {
      pFVar13 = (FILE *)in_RDI[1];
      pcVar5 = QByteArray::constData((QByteArray *)0x10a3a1);
      fprintf(pFVar13,"    QMetaObject::SuperData::link<%s::staticMetaObject>(),\n",pcVar5);
    }
  }
  pFVar13 = (FILE *)in_RDI[1];
  pcVar5 = QByteArray::constData((QByteArray *)0x10a451);
  pcVar6 = QByteArray::constData((QByteArray *)0x10a466);
  fprintf(pFVar13,
          "    qt_staticMetaObjectStaticContent%s.stringdata,\n    qt_staticMetaObjectStaticContent%s.data,\n"
          ,pcVar5,pcVar6);
  if (local_442 == 0) {
    fprintf((FILE *)in_RDI[1],"    nullptr,\n");
  }
  else {
    fprintf((FILE *)in_RDI[1],"    qt_static_metacall,\n");
  }
  bVar2 = QList<QByteArray>::isEmpty((QList<QByteArray> *)0x10a4d4);
  if (bVar2) {
    fprintf((FILE *)in_RDI[1],"    nullptr,\n");
  }
  else {
    pFVar13 = (FILE *)in_RDI[1];
    pcVar5 = QByteArray::constData((QByteArray *)0x10a517);
    fprintf(pFVar13,"    qt_meta_extradata_%s,\n",pcVar5);
  }
  pFVar13 = (FILE *)in_RDI[1];
  pcVar5 = QByteArray::constData((QByteArray *)0x10a551);
  fprintf(pFVar13,"    qt_staticMetaObjectRelocatingContent%s.metaTypes,\n",pcVar5);
  fprintf((FILE *)in_RDI[1],"    nullptr\n} };\n\n");
  if (local_442 != 0) {
    generateStaticMetacall(in_stack_fffffffffffffcd8);
  }
  if ((*(byte *)(in_RDI[2] + 0x1a4) & 1) != 0) {
    pFVar13 = (FILE *)in_RDI[1];
    pcVar5 = QByteArray::constData((QByteArray *)0x10a5e1);
    fprintf(pFVar13,
            "\nconst QMetaObject *%s::metaObject() const\n{\n    return QObject::d_ptr->metaObject ? QObject::d_ptr->dynamicMetaObject() : &staticMetaObject;\n}\n"
            ,pcVar5);
    pFVar13 = (FILE *)in_RDI[1];
    pcVar5 = QByteArray::constData((QByteArray *)0x10a61b);
    fprintf(pFVar13,"\nvoid *%s::qt_metacast(const char *_clname)\n{\n",pcVar5);
    fprintf((FILE *)in_RDI[1],"    if (!_clname) return nullptr;\n");
    pFVar13 = (FILE *)in_RDI[1];
    pcVar5 = QByteArray::constData((QByteArray *)0x10a66f);
    fprintf(pFVar13,
            "    if (!strcmp(_clname, qt_staticMetaObjectStaticContent<qt_meta_tag_%s_t>.strings))\n        return static_cast<void*>(this);\n"
            ,pcVar5);
    qVar7 = QList<SuperClass>::size((QList<SuperClass> *)(in_RDI[2] + 0x88));
    if (1 < qVar7) {
      local_3a8.i = (SuperClass *)&DAT_aaaaaaaaaaaaaaaa;
      local_3b0 = (SuperClass *)
                  QList<SuperClass>::cbegin((QList<SuperClass> *)in_stack_fffffffffffff970);
      local_3a8 = QList<SuperClass>::const_iterator::operator+
                            ((const_iterator *)in_stack_fffffffffffff970,
                             (qsizetype)in_stack_fffffffffffff968);
      local_3b8.i = (SuperClass *)&DAT_aaaaaaaaaaaaaaaa;
      local_3b8 = QList<SuperClass>::cend((QList<SuperClass> *)in_stack_fffffffffffff970);
      while( true ) {
        local_3c0 = local_3b8.i;
        bVar2 = QList<SuperClass>::const_iterator::operator!=(&local_3a8,local_3b8);
        if (!bVar2) break;
        pSVar8 = QList<SuperClass>::const_iterator::operator->(&local_3a8);
        if (pSVar8->access != Private) {
          QList<SuperClass>::const_iterator::operator->(&local_3a8);
          pcVar5 = QByteArray::constData((QByteArray *)0x10a77a);
          fprintf((FILE *)in_RDI[1],
                  "    if (!strcmp(_clname, \"%s\"))\n        return static_cast< %s*>(this);\n",
                  pcVar5,pcVar5);
        }
        QList<SuperClass>::const_iterator::operator++(&local_3a8);
      }
    }
    local_3c8.i = (QList<ClassDef::Interface> *)&DAT_aaaaaaaaaaaaaaaa;
    local_3c8 = QList<QList<ClassDef::Interface>_>::begin
                          ((QList<QList<ClassDef::Interface>_> *)in_stack_fffffffffffff970);
    local_3d0.i = (QList<ClassDef::Interface> *)&DAT_aaaaaaaaaaaaaaaa;
    local_3d0 = QList<QList<ClassDef::Interface>_>::end
                          ((QList<QList<ClassDef::Interface>_> *)in_stack_fffffffffffff970);
    while( true ) {
      local_3d8 = local_3d0.i;
      bVar2 = QList<QList<ClassDef::Interface>_>::const_iterator::operator!=(&local_3c8,local_3d0);
      if (!bVar2) break;
      this_00 = QList<QList<ClassDef::Interface>_>::const_iterator::operator*(&local_3c8);
      local_4d8 = 0;
      while (lVar14 = local_4d8, qVar7 = QList<ClassDef::Interface>::size(this_00), lVar14 < qVar7)
      {
        pFVar13 = (FILE *)in_RDI[1];
        QList<ClassDef::Interface>::at
                  ((QList<ClassDef::Interface> *)in_stack_fffffffffffff970,
                   (qsizetype)in_stack_fffffffffffff968);
        pcVar5 = QByteArray::constData((QByteArray *)0x10a8fe);
        fprintf(pFVar13,"    if (!strcmp(_clname, %s))\n        return ",pcVar5);
        for (local_4e0 = local_4d8; -1 < local_4e0; local_4e0 = local_4e0 + -1) {
          in_stack_fffffffffffff9f0 = (FILE *)in_RDI[1];
          QList<ClassDef::Interface>::at
                    ((QList<ClassDef::Interface> *)in_stack_fffffffffffff970,
                     (qsizetype)in_stack_fffffffffffff968);
          pcVar5 = QByteArray::constData((QByteArray *)0x10a963);
          fprintf(in_stack_fffffffffffff9f0,"static_cast< %s*>(",pcVar5);
        }
        in_stack_fffffffffffff9e8 = (FILE *)in_RDI[1];
        QByteArray::QByteArray(&local_3f0,local_4d8 + 1,')');
        pcVar5 = QByteArray::constData((QByteArray *)0x10a9d1);
        fprintf(in_stack_fffffffffffff9e8,"this%s;\n",pcVar5);
        QByteArray::~QByteArray((QByteArray *)0x10a9f7);
        local_4d8 = local_4d8 + 1;
      }
      QList<QList<ClassDef::Interface>_>::const_iterator::operator++(&local_3c8);
    }
    bVar2 = QByteArray::isEmpty((QByteArray *)0x10aa35);
    if ((bVar2) || (bVar1)) {
      fprintf((FILE *)in_RDI[1],"    return nullptr;\n");
    }
    else {
      local_408 = &DAT_aaaaaaaaaaaaaaaa;
      local_400 = &DAT_aaaaaaaaaaaaaaaa;
      local_3f8 = &DAT_aaaaaaaaaaaaaaaa;
      QByteArray::QByteArray
                ((QByteArray *)in_stack_fffffffffffff970,(QByteArray *)in_stack_fffffffffffff968);
      in_stack_fffffffffffff9e0 = (FILE *)in_RDI[1];
      pcVar5 = QByteArray::constData((QByteArray *)0x10aaaf);
      fprintf(in_stack_fffffffffffff9e0,"    return %s::qt_metacast(_clname);\n",pcVar5);
      QByteArray::~QByteArray((QByteArray *)0x10aad2);
    }
    fprintf((FILE *)in_RDI[1],"}\n");
    if ((*(byte *)(*in_RDI + 0x22) & 1) == 0) {
      generateMetacall(in_stack_fffffffffffff9b8);
      for (local_4e4 = 0;
          qVar7 = QList<FunctionDef>::size((QList<FunctionDef> *)(in_RDI[2] + 0x110)),
          local_4e4 < (int)qVar7; local_4e4 = local_4e4 + 1) {
        QList<FunctionDef>::at
                  ((QList<FunctionDef> *)in_stack_fffffffffffff970,
                   (qsizetype)in_stack_fffffffffffff968);
        generateSignal((Generator *)in_stack_fffffffffffff9f0,
                       (FunctionDef *)in_stack_fffffffffffff9e8,
                       (int)((ulong)in_stack_fffffffffffff9e0 >> 0x20));
      }
      generatePluginMetaData(in_stack_fffffffffffff9c8);
      bVar1 = QList<QByteArray>::isEmpty((QList<QByteArray> *)0x10abde);
      if (!bVar1) {
        pFVar13 = (FILE *)in_RDI[1];
        pcVar5 = QByteArray::constData((QByteArray *)0x10ac04);
        fprintf(pFVar13,"namespace CheckNotifySignalValidity_%s {\n",pcVar5);
        local_410.i = (QByteArray *)&DAT_aaaaaaaaaaaaaaaa;
        local_410 = QList<QByteArray>::begin((QList<QByteArray> *)in_stack_fffffffffffff970);
        local_418.i = (QByteArray *)&DAT_aaaaaaaaaaaaaaaa;
        local_418 = QList<QByteArray>::end((QList<QByteArray> *)in_stack_fffffffffffff970);
        while( true ) {
          local_420 = local_418.i;
          bVar1 = QList<QByteArray>::const_iterator::operator!=(&local_410,local_418);
          if (!bVar1) break;
          QList<QByteArray>::const_iterator::operator*(&local_410);
          local_428.i = (PropertyDef *)&DAT_aaaaaaaaaaaaaaaa;
          QList<PropertyDef>::constBegin((QList<PropertyDef> *)in_stack_fffffffffffff970);
          QList<PropertyDef>::constEnd((QList<PropertyDef> *)in_stack_fffffffffffff970);
          local_428 = std::
                      find_if<QList<PropertyDef>::const_iterator,Generator::generateCode()::__0>
                                (in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,
                                 in_stack_fffffffffffff998);
          pFVar13 = (FILE *)in_RDI[1];
          pcVar5 = QByteArray::constData((QByteArray *)0x10ad8e);
          pcVar6 = QByteArray::constData((QByteArray *)0x10ada0);
          fprintf(pFVar13,
                  "template<typename T> using has_nullary_%s = decltype(std::declval<T>().%s());\n",
                  pcVar5,pcVar6);
          QList<PropertyDef>::const_iterator::operator->(&local_428);
          pFVar13 = (FILE *)in_RDI[1];
          in_stack_fffffffffffff998.nonClassSignal =
               (QByteArray *)QByteArray::constData((QByteArray *)0x10ae07);
          in_stack_fffffffffffff9a0.i = (PropertyDef *)QByteArray::constData((QByteArray *)0x10ae19)
          ;
          pcVar5 = QByteArray::constData((QByteArray *)0x10ae2b);
          fprintf(pFVar13,
                  "template<typename T> using has_unary_%s = decltype(std::declval<T>().%s(std::declval<%s>()));\n"
                  ,in_stack_fffffffffffff998.nonClassSignal,in_stack_fffffffffffff9a0.i,pcVar5);
          in_stack_fffffffffffff9a8.i = (PropertyDef *)in_RDI[1];
          pcVar5 = QByteArray::constData((QByteArray *)0x10ae69);
          pcVar6 = QByteArray::constData((QByteArray *)0x10ae86);
          pcVar9 = QByteArray::constData((QByteArray *)0x10ae98);
          pcVar10 = QByteArray::constData((QByteArray *)0x10aeb5);
          pcVar11 = QByteArray::constData((QByteArray *)0x10aec7);
          fprintf((FILE *)in_stack_fffffffffffff9a8.i,
                  "static_assert(qxp::is_detected_v<has_nullary_%s, %s> || qxp::is_detected_v<has_unary_%s, %s>,\n              \"NOTIFY signal %s does not exist in class (or is private in its parent)\");\n"
                  ,pcVar5,pcVar6,pcVar9,pcVar10,pcVar11);
          QList<QByteArray>::const_iterator::operator++(&local_410);
        }
        fprintf((FILE *)in_RDI[1],"}\n");
      }
    }
  }
  QMultiHash<QByteArray,_QByteArray>::~QMultiHash
            ((QMultiHash<QByteArray,_QByteArray> *)in_stack_fffffffffffff970);
  QList<QByteArray>::~QList((QList<QByteArray> *)0x10af43);
  QByteArray::~QByteArray((QByteArray *)0x10af50);
  QByteArray::~QByteArray((QByteArray *)0x10af5d);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Generator::generateCode()
{
    bool isQObject = (cdef->classname == "QObject");
    bool isConstructible = !cdef->constructorList.isEmpty();

    // filter out undeclared enumerators and sets
    {
        QList<EnumDef> enumList;
        for (EnumDef def : std::as_const(cdef->enumList)) {
            if (cdef->enumDeclarations.contains(def.name)) {
                enumList += def;
            }
            def.enumName = def.name;
            QByteArray alias = cdef->flagAliases.value(def.name);
            if (cdef->enumDeclarations.contains(alias)) {
                def.name = alias;
                def.flags |= cdef->enumDeclarations[alias];
                enumList += def;
            }
        }
        cdef->enumList = enumList;
    }

//
// Register all strings used in data section
//
    strreg(cdef->qualified);
    registerClassInfoStrings();
    registerFunctionStrings(cdef->signalList);
    registerFunctionStrings(cdef->slotList);
    registerFunctionStrings(cdef->methodList);
    registerFunctionStrings(cdef->constructorList);
    registerByteArrayVector(cdef->nonClassSignalList);
    registerPropertyStrings();
    registerEnumStrings();

    const bool requireCompleteness = requireCompleteTypes || cdef->requireCompleteMethodTypes;
    bool hasStaticMetaCall =
            (cdef->hasQObject || !cdef->methodList.isEmpty()
             || !cdef->propertyList.isEmpty() || !cdef->constructorList.isEmpty());
    if (parser->activeQtMode)
        hasStaticMetaCall = false;

    const QByteArray qualifiedClassNameIdentifier = generateQualifiedClassNameIdentifier(cdef->qualified);

    // type name for the Q_OJBECT/GADGET itself, void for namespaces
    const char *ownType = !cdef->hasQNamespace ? cdef->classname.data() : "void";

    // ensure the qt_meta_tag_XXXX_t type is local
    fprintf(out, "namespace {\n"
                 "struct qt_meta_tag_%s_t {};\n"
                 "} // unnamed namespace\n\n",
            qualifiedClassNameIdentifier.constData());

//
// build the strings, data, and metatype arrays
//

    // We define a method inside the context of the class or namespace we're
    // creating the meta object for, so we get access to everything it has
    // access to and with the same contexts (for example, member enums and
    // types).
    fprintf(out, "template <> constexpr inline auto %s::qt_create_metaobjectdata<qt_meta_tag_%s_t>()\n"
                 "{\n"
                 "    namespace QMC = QtMocConstants;\n",
            cdef->qualified.constData(), qualifiedClassNameIdentifier.constData());

    fprintf(out, "    QtMocHelpers::StringRefStorage qt_stringData {");
    addStrings(strings);
    fprintf(out, "\n    };\n\n");

    fprintf(out, "    QtMocHelpers::UintData qt_methods {\n");

    // Build signals array first, otherwise the signal indices would be wrong
    addFunctions(cdef->signalList, "Signal");
    addFunctions(cdef->slotList, "Slot");
    addFunctions(cdef->methodList, "Method");
    fprintf(out, "    };\n"
                 "    QtMocHelpers::UintData qt_properties {\n");
    addProperties();
    fprintf(out, "    };\n"
                 "    QtMocHelpers::UintData qt_enums {\n");
    addEnums();
    fprintf(out, "    };\n");

    const char *uintDataParams = "";
    if (isConstructible || !cdef->classInfoList.isEmpty()) {
        if (isConstructible) {
            fprintf(out, "    using Constructor = QtMocHelpers::NoType;\n"
                         "    QtMocHelpers::UintData qt_constructors {\n");
            addFunctions(cdef->constructorList, "Constructor");
            fprintf(out, "    };\n");
        } else {
            fputs("    QtMocHelpers::UintData qt_constructors {};\n", out);
        }

        uintDataParams = ", qt_constructors";
        if (!cdef->classInfoList.isEmpty()) {
            fprintf(out, "    QtMocHelpers::ClassInfos qt_classinfo({\n");
            addClassInfos();
            fprintf(out, "    });\n");
            uintDataParams = ", qt_constructors, qt_classinfo";
        }
    }

    const char *metaObjectFlags = "QMC::MetaObjectFlag{}";
    if (cdef->hasQGadget || cdef->hasQNamespace) {
        // Ideally, all the classes could have that flag. But this broke
        // classes generated by qdbusxml2cpp which generate code that require
        // that we call qt_metacall for properties.
        metaObjectFlags = "QMC::PropertyAccessInStaticMetaCall";
    }
    {
        QByteArray tagType = QByteArrayLiteral("void");
        if (!requireCompleteness)
            tagType = "qt_meta_tag_" + qualifiedClassNameIdentifier +  "_t";
        fprintf(out, "    return QtMocHelpers::metaObjectData<%s, %s>(%s, qt_stringData,\n"
                     "            qt_methods, qt_properties, qt_enums%s);\n"
                     "}\n",
                ownType, tagType.constData(), metaObjectFlags, uintDataParams);
    }

    QByteArray metaVarNameSuffix;
    if (cdef->hasQNamespace) {
        // Q_NAMESPACE does not define the variables, so we have to. Declare as
        // plain, file-scope static variables (not templates).
        metaVarNameSuffix = '_' + qualifiedClassNameIdentifier;
        const char *n = metaVarNameSuffix.constData();
        fprintf(out, R"(
static constexpr auto qt_staticMetaObjectContent%s =
    %s::qt_create_metaobjectdata<qt_meta_tag%s_t>();
static constexpr auto qt_staticMetaObjectStaticContent%s =
    qt_staticMetaObjectContent%s.staticData;
static constexpr auto qt_staticMetaObjectRelocatingContent%s =
    qt_staticMetaObjectContent%s.relocatingData;

)",
                n, cdef->qualified.constData(), n,
                n, n,
                n, n);
    } else {
        // Q_OBJECT and Q_GADGET do declare them, so we just use the templates.
        metaVarNameSuffix = "<qt_meta_tag_" + qualifiedClassNameIdentifier + "_t>";
    }

//
// Build extra array
//
    QList<QByteArray> extraList;
    QMultiHash<QByteArray, QByteArray> knownExtraMetaObject(knownGadgets);
    knownExtraMetaObject.unite(knownQObjectClasses);

    for (const PropertyDef &p : std::as_const(cdef->propertyList)) {
        if (isBuiltinType(p.type))
            continue;

        if (p.type.contains('*') || p.type.contains('<') || p.type.contains('>'))
            continue;

        const qsizetype s = p.type.lastIndexOf("::");
        if (s <= 0)
            continue;

        QByteArray unqualifiedScope = p.type.left(s);

        // The scope may be a namespace for example, so it's only safe to include scopes that are known QObjects (QTBUG-2151)
        QMultiHash<QByteArray, QByteArray>::ConstIterator scopeIt;

        QByteArray thisScope = cdef->qualified;
        do {
            const qsizetype s = thisScope.lastIndexOf("::");
            thisScope = thisScope.left(s);
            QByteArray currentScope = thisScope.isEmpty() ? unqualifiedScope : thisScope + "::" + unqualifiedScope;
            scopeIt = knownExtraMetaObject.constFind(currentScope);
        } while (!thisScope.isEmpty() && scopeIt == knownExtraMetaObject.constEnd());

        if (scopeIt == knownExtraMetaObject.constEnd())
            continue;

        const QByteArray &scope = *scopeIt;

        if (scope == "Qt")
            continue;
        if (qualifiedNameEquals(cdef->qualified, scope))
            continue;

        if (!extraList.contains(scope))
            extraList += scope;
    }

    // QTBUG-20639 - Accept non-local enums for QML signal/slot parameters.
    // Look for any scoped enum declarations, and add those to the list
    // of extra/related metaobjects for this object.
    for (auto it = cdef->enumDeclarations.keyBegin(),
         end = cdef->enumDeclarations.keyEnd(); it != end; ++it) {
        const QByteArray &enumKey = *it;
        const qsizetype s = enumKey.lastIndexOf("::");
        if (s > 0) {
            QByteArray scope = enumKey.left(s);
            if (scope != "Qt" && !qualifiedNameEquals(cdef->qualified, scope) && !extraList.contains(scope))
                extraList += scope;
        }
    }

//
// Generate meta object link to parent meta objects
//

    if (!extraList.isEmpty()) {
        fprintf(out, "Q_CONSTINIT static const QMetaObject::SuperData qt_meta_extradata_%s[] = {\n",
                qualifiedClassNameIdentifier.constData());
        for (const QByteArray &ba : std::as_const(extraList))
            fprintf(out, "    QMetaObject::SuperData::link<%s::staticMetaObject>(),\n", ba.constData());

        fprintf(out, "    nullptr\n};\n\n");
    }

//
// Finally create and initialize the static meta object
//
    fprintf(out, "Q_CONSTINIT const QMetaObject %s::staticMetaObject = { {\n",
            cdef->qualified.constData());

    if (isQObject)
        fprintf(out, "    nullptr,\n");
    else if (cdef->superclassList.size() && !cdef->hasQGadget && !cdef->hasQNamespace) // for qobject, we know the super class must have a static metaobject
        fprintf(out, "    QMetaObject::SuperData::link<%s::staticMetaObject>(),\n", purestSuperClass.constData());
    else if (cdef->superclassList.size()) // for gadgets we need to query at compile time for it
        fprintf(out, "    QtPrivate::MetaObjectForType<%s>::value,\n", purestSuperClass.constData());
    else
        fprintf(out, "    nullptr,\n");
    fprintf(out, "    qt_staticMetaObjectStaticContent%s.stringdata,\n"
            "    qt_staticMetaObjectStaticContent%s.data,\n",
            metaVarNameSuffix.constData(),
            metaVarNameSuffix.constData());
    if (hasStaticMetaCall)
        fprintf(out, "    qt_static_metacall,\n");
    else
        fprintf(out, "    nullptr,\n");

    if (extraList.isEmpty())
        fprintf(out, "    nullptr,\n");
    else
        fprintf(out, "    qt_meta_extradata_%s,\n", qualifiedClassNameIdentifier.constData());

    fprintf(out, "    qt_staticMetaObjectRelocatingContent%s.metaTypes,\n",
            metaVarNameSuffix.constData());

    fprintf(out, "    nullptr\n} };\n\n");

//
// Generate internal qt_static_metacall() function
//
    if (hasStaticMetaCall)
        generateStaticMetacall();

    if (!cdef->hasQObject)
        return;

    fprintf(out, "\nconst QMetaObject *%s::metaObject() const\n{\n"
                 "    return QObject::d_ptr->metaObject ? QObject::d_ptr->dynamicMetaObject() : &staticMetaObject;\n"
                 "}\n",
            cdef->qualified.constData());

//
// Generate smart cast function
//
    fprintf(out, "\nvoid *%s::qt_metacast(const char *_clname)\n{\n", cdef->qualified.constData());
    fprintf(out, "    if (!_clname) return nullptr;\n");
    fprintf(out, "    if (!strcmp(_clname, qt_staticMetaObjectStaticContent<qt_meta_tag_%s_t>.strings))\n"
                  "        return static_cast<void*>(this);\n",
            qualifiedClassNameIdentifier.constData());

    // for all superclasses but the first one
    if (cdef->superclassList.size() > 1) {
        auto it = cdef->superclassList.cbegin() + 1;
        const auto end = cdef->superclassList.cend();
        for (; it != end; ++it) {
            if (it->access == FunctionDef::Private)
                continue;
            const char *cname = it->classname.constData();
            fprintf(out, "    if (!strcmp(_clname, \"%s\"))\n        return static_cast< %s*>(this);\n",
                    cname, cname);
        }
    }

    for (const QList<ClassDef::Interface> &iface : std::as_const(cdef->interfaceList)) {
        for (qsizetype j = 0; j < iface.size(); ++j) {
            fprintf(out, "    if (!strcmp(_clname, %s))\n        return ", iface.at(j).interfaceId.constData());
            for (qsizetype k = j; k >= 0; --k)
                fprintf(out, "static_cast< %s*>(", iface.at(k).className.constData());
            fprintf(out, "this%s;\n", QByteArray(j + 1, ')').constData());
        }
    }
    if (!purestSuperClass.isEmpty() && !isQObject) {
        QByteArray superClass = purestSuperClass;
        fprintf(out, "    return %s::qt_metacast(_clname);\n", superClass.constData());
    } else {
        fprintf(out, "    return nullptr;\n");
    }
    fprintf(out, "}\n");

    if (parser->activeQtMode)
        return;

//
// Generate internal qt_metacall()  function
//
    generateMetacall();

//
// Generate internal signal functions
//
    for (int signalindex = 0; signalindex < int(cdef->signalList.size()); ++signalindex)
        generateSignal(&cdef->signalList.at(signalindex), signalindex);

//
// Generate plugin meta data
//
    generatePluginMetaData();

//
// Generate function to make sure the non-class signals exist in the parent classes
//
    if (!cdef->nonClassSignalList.isEmpty()) {
        fprintf(out, "namespace CheckNotifySignalValidity_%s {\n", qualifiedClassNameIdentifier.constData());
        for (const QByteArray &nonClassSignal : std::as_const(cdef->nonClassSignalList)) {
            const auto propertyIt = std::find_if(cdef->propertyList.constBegin(),
                                   cdef->propertyList.constEnd(),
                                   [&nonClassSignal](const PropertyDef &p) {
                return nonClassSignal == p.notify;
            });
            // must find something, otherwise checkProperties wouldn't have inserted an entry into nonClassSignalList
            Q_ASSERT(propertyIt != cdef->propertyList.constEnd());
            fprintf(out, "template<typename T> using has_nullary_%s = decltype(std::declval<T>().%s());\n",
                    nonClassSignal.constData(),
                    nonClassSignal.constData());
            const auto &propertyType = propertyIt->type;
            fprintf(out, "template<typename T> using has_unary_%s = decltype(std::declval<T>().%s(std::declval<%s>()));\n",
                    nonClassSignal.constData(),
                    nonClassSignal.constData(),
                    propertyType.constData());
            fprintf(out, "static_assert(qxp::is_detected_v<has_nullary_%s, %s> || qxp::is_detected_v<has_unary_%s, %s>,\n"
                         "              \"NOTIFY signal %s does not exist in class (or is private in its parent)\");\n",
                    nonClassSignal.constData(), cdef->qualified.constData(),
                    nonClassSignal.constData(), cdef->qualified.constData(),
                    nonClassSignal.constData());
        }
        fprintf(out, "}\n");
    }
}